

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O1

void __thiscall
double_conversion::Double::NormalizedBoundaries(Double *this,DiyFp *out_m_minus,DiyFp *out_m_plus)

{
  ulong uVar1;
  uint64_t d64;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar1 = this->d64_;
  uVar7 = uVar1 & 0xfffffffffffff;
  bVar11 = (uVar1 & 0x7ff0000000000000) == 0;
  uVar5 = uVar7 + 0x10000000000000;
  if (bVar11) {
    uVar5 = uVar7;
  }
  iVar8 = -0x432;
  if (!bVar11) {
    iVar8 = ((uint)(uVar1 >> 0x34) & 0x7ff) - 0x433;
  }
  lVar6 = uVar5 * 2;
  iVar9 = iVar8 + -1;
  uVar2 = uVar5 * 2 + 1;
  iVar4 = iVar9;
  do {
    uVar3 = uVar2 << 10;
    iVar4 = iVar4 + -10;
    uVar10 = uVar2 >> 0x2c;
    uVar2 = uVar3;
  } while (uVar10 == 0);
  for (; -1 < (long)uVar3; uVar3 = uVar3 * 2) {
    iVar4 = iVar4 + -1;
  }
  if ((uVar7 == 0) && ((uVar1 & 0x7fe0000000000000) != 0)) {
    lVar6 = uVar5 << 2;
    iVar9 = iVar8 + -2;
  }
  out_m_plus->f_ = uVar3;
  out_m_plus->e_ = iVar4;
  out_m_minus->f_ = lVar6 + -1 << ((char)iVar9 - (char)iVar4 & 0x3fU);
  out_m_minus->e_ = iVar4;
  return;
}

Assistant:

uint64_t AsUint64() const {
    return d64_;
  }